

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

ExprPtr __thiscall pegmatite::range(pegmatite *this,char32_t min,char32_t max)

{
  Expr *__p;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  reference rVar1;
  ExprPtr EVar2;
  
  __p = (Expr *)operator_new(0x30);
  __p->_vptr_Expr = (_func_int **)&PTR__SetExpr_001660f0;
  __p[1]._vptr_Expr = (_func_int **)0x0;
  *(undefined4 *)&__p[2]._vptr_Expr = 0;
  __p[3]._vptr_Expr = (_func_int **)0x0;
  *(undefined4 *)&__p[4]._vptr_Expr = 0;
  __p[5]._vptr_Expr = (_func_int **)0x0;
  if ((uint)min <= (uint)max) {
    std::vector<bool,_std::allocator<bool>_>::resize
              ((vector<bool,_std::allocator<bool>_> *)(__p + 1),(ulong)(uint)max + 1,false);
    for (; (uint)min <= (uint)max; min = min + L'\x01') {
      rVar1 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)(__p + 1),(ulong)(uint)min);
      *rVar1._M_p = *rVar1._M_p | rVar1._M_mask;
    }
    std::__shared_ptr<pegmatite::Expr,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<pegmatite::Expr,void>
              ((__shared_ptr<pegmatite::Expr,(__gnu_cxx::_Lock_policy)2> *)this,__p);
    EVar2.super_shared_ptr<pegmatite::Expr>.
    super___shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    EVar2.super_shared_ptr<pegmatite::Expr>.
    super___shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
    return (ExprPtr)EVar2.super_shared_ptr<pegmatite::Expr>.
                    super___shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>;
  }
  __assert_fail("min <= max",
                "/workspace/llm4binary/github/license_c_cmakelists/CompilerTeaching[P]Pegmatite/parser.cc"
                ,0x1ac,"(anonymous namespace)::SetExpr::SetExpr(char32_t, char32_t)");
}

Assistant:

ExprPtr range(char32_t min, char32_t max)
{
	return ExprPtr(new SetExpr(min, max));
}